

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  bool bVar1;
  FILE *pFVar2;
  ostream *poVar3;
  GTestLog local_54;
  FilePath output_dir;
  FilePath output_file_path;
  
  FilePath::FilePath(&output_file_path,output_file);
  FilePath::RemoveFileName(&output_dir,&output_file_path);
  bVar1 = FilePath::CreateDirectoriesRecursively(&output_dir);
  if (bVar1) {
    pFVar2 = fopen((output_file->_M_dataplus)._M_p,"w");
    if (pFVar2 != (FILE *)0x0) goto LAB_0011cd20;
  }
  GTestLog::GTestLog(&local_54,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/googletest/googletest/src/gtest.cc"
                     ,0xc6);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to open file \"");
  poVar3 = std::operator<<(poVar3,(string *)output_file);
  std::operator<<(poVar3,"\"");
  GTestLog::~GTestLog(&local_54);
  pFVar2 = (FILE *)0x0;
LAB_0011cd20:
  std::__cxx11::string::~string((string *)&output_dir);
  std::__cxx11::string::~string((string *)&output_file_path);
  return (FILE *)pFVar2;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}